

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_ORN_pppp(DisasContext_conflict1 *s,arg_rprr_s *a)

{
  arg_rprr_s *a_local;
  DisasContext_conflict1 *s_local;
  
  if (a->s == 0) {
    s_local._7_1_ = do_vecop4_p(s,&trans_ORN_pppp::op,a->rd,a->rn,a->rm,a->pg);
  }
  else {
    s_local._7_1_ = do_pppp_flags(s,a,&trans_ORN_pppp::op);
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_ORN_pppp(DisasContext *s, arg_rprr_s *a)
{
    static const GVecGen4 op = {
        .fni8 = gen_orn_pg_i64,
        .fniv = gen_orn_pg_vec,
        .fno = gen_helper_sve_orn_pppp,
        .prefer_i64 = TCG_TARGET_REG_BITS == 64,
    };
    if (a->s) {
        return do_pppp_flags(s, a, &op);
    } else {
        return do_vecop4_p(s, &op, a->rd, a->rn, a->rm, a->pg);
    }
}